

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void init_proc_7400(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  undefined8 uVar2;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_7xx(env);
  gen_tbl(env);
  gen_spr_74xx(env);
  if ((((env->spr_cb[0x3a7].name == (char *)0x0) && (env->spr[0x3a7] == 0)) &&
      (env->spr_cb[0x3a7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3a7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3a7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3a7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3a7].name = "UBAMR";
    env->spr_cb[0x3a7].uea_read = spr_read_ureg;
    env->spr_cb[0x3a7].uea_write = spr_noaccess;
    env->spr_cb[0x3a7].oea_read = spr_read_ureg;
    env->spr_cb[0x3a7].oea_write = spr_noaccess;
    env->spr_cb[0x3a7].hea_read = spr_read_ureg;
    env->spr_cb[0x3a7].hea_write = spr_noaccess;
    env->spr_cb[0x3a7].default_value = 0;
    env->spr[0x3a7] = 0;
    if (((env->spr_cb[0x3f7].name == (char *)0x0) && (env->spr[0x3f7] == 0)) &&
       ((env->spr_cb[0x3f7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f7].name = "MSSCR1";
      env->spr_cb[0x3f7].uea_read = spr_noaccess;
      env->spr_cb[0x3f7].uea_write = spr_noaccess;
      env->spr_cb[0x3f7].oea_read = spr_read_generic;
      env->spr_cb[0x3f7].oea_write = spr_write_generic;
      env->spr_cb[0x3f7].hea_read = spr_read_generic;
      env->spr_cb[0x3f7].hea_write = spr_write_generic;
      env->spr_cb[0x3f7].default_value = 0;
      env->spr[0x3f7] = 0;
      gen_spr_thrm(env);
      gen_low_BATs(env);
      env->excp_vectors[0x40] = 0x100;
      env->excp_vectors[1] = 0x200;
      env->excp_vectors[2] = 0x300;
      env->excp_vectors[3] = 0x400;
      env->excp_vectors[4] = 0x500;
      env->excp_vectors[5] = 0x600;
      env->excp_vectors[6] = 0x700;
      env->excp_vectors[7] = 0x800;
      env->excp_vectors[10] = 0x900;
      env->excp_vectors[8] = 0xc00;
      env->excp_vectors[0x44] = 0xd00;
      env->excp_vectors[0x55] = 0xf00;
      env->excp_vectors[0x49] = 0xf20;
      env->excp_vectors[0x53] = 0x1300;
      env->excp_vectors[0x54] = 0x1400;
      env->excp_vectors[0x57] = 0x1600;
      env->excp_vectors[0x56] = 0x1700;
      env->hreset_vector = 0x100;
      env->dcache_line_size = 0x20;
      env->icache_line_size = 0x20;
      ppc6xx_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
      return;
    }
    uVar2 = 0x3f7;
    uVar1 = 0x3f7;
  }
  else {
    uVar2 = 0x3a7;
    uVar1 = 0x3a7;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_7400(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_7xx(env);
    /* Time base */
    gen_tbl(env);
    /* 74xx specific SPR */
    gen_spr_74xx(env);
    /* XXX : not implemented */
    spr_register(env, SPR_UBAMR, "UBAMR",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX: this seems not implemented on all revisions. */
    /* XXX : not implemented */
    spr_register(env, SPR_MSSCR1, "MSSCR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Thermal management */
    gen_spr_thrm(env);
    /* Memory management */
    gen_low_BATs(env);
    init_excp_7400(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}